

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

llm_graph_result_ptr __thiscall
llama_context::build_kv_self_defrag(llama_context *this,ggml_context *ctx0,ggml_cgraph *gf)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  llama_model *plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  undefined8 in_RCX;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  
  plVar7 = (llama_model *)operator_new(0x38);
  *(undefined ***)plVar7 = &PTR__llm_graph_result_00285760;
  (plVar7->name)._M_dataplus._M_p = (pointer)0x0;
  (plVar7->name)._M_string_length = 0;
  (plVar7->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(plVar7->name).field_2 + 8) = 0;
  (plVar7->hparams).vocab_only = false;
  (plVar7->hparams).rope_finetuned = false;
  (plVar7->hparams).use_par_res = false;
  (plVar7->hparams).swin_norm = false;
  (plVar7->hparams).n_ctx_train = 0;
  (plVar7->hparams).n_embd = 0;
  (plVar7->hparams).n_embd_features = 0;
  lVar2 = *(long *)(ctx0 + 0x220);
  lVar13 = *(long *)(lVar2 + 8);
  lVar14 = *(long *)(lVar2 + 0x10);
  if (lVar14 - lVar13 != 0) {
    lVar3 = *(long *)ctx0;
    uVar15 = lVar14 - lVar13 >> 2;
    uVar20 = 0;
    do {
      uVar1 = *(uint *)(lVar13 + uVar20 * 4);
      uVar21 = (ulong)uVar1;
      uVar19 = (uint)uVar20;
      if ((uVar19 != uVar1) && (uVar15 != uVar21)) {
        uVar16 = (ulong)(uVar19 + 1);
        iVar18 = 1;
        if (uVar16 < uVar15) {
          iVar17 = 1;
          do {
            iVar18 = iVar17;
            if (uVar1 + iVar17 != *(int *)(lVar13 + uVar16 * 4)) break;
            iVar18 = iVar17 + 1;
            uVar16 = (ulong)(iVar17 + uVar19 + 1);
            iVar17 = iVar18;
          } while (uVar16 < uVar15);
        }
        if (*(int *)(lVar3 + 0x38) != 0) {
          uVar15 = 0;
          do {
            uVar5 = llama_hparams::n_embd_k_gqa((llama_hparams *)(lVar3 + 0x28),(uint32_t)uVar15);
            uVar6 = llama_hparams::n_embd_v_gqa((llama_hparams *)(lVar3 + 0x28),(uint32_t)uVar15);
            uVar16 = (ulong)uVar5;
            puVar4 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar15 * 8);
            uVar8 = ggml_row_size(*puVar4,uVar16);
            uVar9 = ggml_row_size(**(undefined4 **)
                                    (*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar15 * 8),
                                  uVar20 * uVar16);
            uVar8 = ggml_view_2d(gf,puVar4,uVar16,iVar18,uVar8,uVar9);
            puVar4 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar15 * 8);
            uVar9 = ggml_row_size(*puVar4,uVar16);
            uVar10 = ggml_row_size(**(undefined4 **)
                                     (*(long *)(*(long *)(ctx0 + 0x220) + 0x90) + uVar15 * 8),
                                   uVar16 * uVar21);
            uVar9 = ggml_view_2d(gf,puVar4,uVar16,iVar18,uVar9,uVar10);
            uVar16 = (ulong)uVar6;
            puVar4 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar15 * 8);
            if (ctx0[0x43] == (ggml_context)0x1) {
              uVar10 = ggml_row_size(*puVar4,uVar16);
              uVar11 = ggml_row_size(**(undefined4 **)
                                       (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar15 * 8),
                                     uVar20 * uVar16);
              uVar10 = ggml_view_2d(gf,puVar4,uVar16,iVar18,uVar10,uVar11);
              puVar4 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar15 * 8);
              uVar11 = ggml_row_size(*puVar4,uVar16);
              uVar12 = ggml_row_size(**(undefined4 **)
                                       (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar15 * 8),
                                     uVar16 * uVar21);
              uVar11 = ggml_view_2d(gf,puVar4,uVar16,iVar18,uVar11,uVar12);
            }
            else {
              uVar10 = ggml_row_size(*puVar4,*(undefined4 *)(*(long *)(ctx0 + 0x220) + 0x6c));
              uVar11 = ggml_row_size(**(undefined4 **)
                                       (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar15 * 8),
                                     uVar20);
              uVar10 = ggml_view_2d(gf,puVar4,iVar18,uVar16,uVar10,uVar11);
              puVar4 = *(undefined4 **)(*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar15 * 8);
              uVar11 = ggml_row_size(*puVar4,*(undefined4 *)(*(long *)(ctx0 + 0x220) + 0x6c));
              uVar12 = ggml_row_size(**(undefined4 **)
                                       (*(long *)(*(long *)(ctx0 + 0x220) + 0xa8) + uVar15 * 8),
                                     uVar21);
              uVar11 = ggml_view_2d(gf,puVar4,iVar18,uVar16,uVar11,uVar12);
            }
            uVar8 = ggml_cpy(gf,uVar8,uVar9);
            ggml_build_forward_expand(in_RCX,uVar8);
            uVar8 = ggml_cpy(gf,uVar10,uVar11);
            ggml_build_forward_expand(in_RCX,uVar8);
            uVar15 = uVar15 + 1;
          } while (uVar15 < *(uint *)(lVar3 + 0x38));
          lVar13 = *(long *)(lVar2 + 8);
          lVar14 = *(long *)(lVar2 + 0x10);
        }
        uVar20 = (ulong)((uVar19 + iVar18) - 1);
      }
      uVar20 = (ulong)((int)uVar20 + 1);
      uVar15 = lVar14 - lVar13 >> 2;
    } while (uVar20 < uVar15);
  }
  this->model = plVar7;
  return (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         this;
}

Assistant:

llm_graph_result_ptr llama_context::build_kv_self_defrag(
        ggml_context * ctx0,
        ggml_cgraph * gf) const {
    auto res = std::make_unique<llm_graph_result>();

    const auto & hparams = model.hparams;

    const auto & ids = kv_self->defrag_info.ids;

#if 0
    // CPU defrag
    //
    // TODO: optimizations are possible:
    //       - multiple threads
    //       - avoid copying to the host memory when already there
    //
    // likely not worth the effort, as we have ggml_graph based defrag
    //

    const uint32_t n_embd_k_gqa = hparams.n_embd_k_gqa();
    const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa();

    const uint32_t kv_size = size;

    std::vector<uint8_t> buf_k;
    std::vector<uint8_t> buf_v;

    for (uint32_t il = 0; il < n_layer; ++il) {
        const size_t k_size_row = ggml_row_size(k_l[il]->type, n_embd_k_gqa);
        const size_t k_size     = ggml_row_size(k_l[il]->type, n_embd_k_gqa*kv_size);

        const size_t v_size_el = ggml_type_size(v_l[il]->type);
        const size_t v_size    = ggml_row_size (v_l[il]->type, n_embd_v_gqa*kv_size);

        buf_k.resize(k_size);
        buf_v.resize(v_size);

        ggml_backend_tensor_get(k_l[il], buf_k.data(), 0, buf_k.size());
        ggml_backend_tensor_get(v_l[il], buf_v.data(), 0, buf_v.size());

        // batch move [i, i+nm) to [id, id+nm)
        // note: cells can move only to a lower index
        for (uint32_t i = 0; i < n_kv; ++i) {
            const uint32_t id = ids[i];

            if (i == id || id == n_kv) {
                continue;
            }

            uint32_t nm = 1;

            while (i + nm < n_kv && ids[i + nm] == id + nm) {
                nm++;
            }

            // move keys
            {
                const int64_t os =  i*k_size_row;
                const int64_t od = id*k_size_row;

                memcpy(buf_k.data() + od, buf_k.data() + os, nm*k_size_row);
            }

            // move values (note: they are transposed)
            {
                const int64_t os =  i;
                const int64_t od = id;

                for (uint32_t j = 0; j < n_embd_v_gqa; ++j) {
                    memcpy(buf_v.data() + (od + j*kv_size)*v_size_el, buf_v.data() + (os + j*kv_size)*v_size_el, nm*v_size_el);
                }
            }

            i += nm - 1;
        }

        ggml_backend_tensor_set(k_l[il], buf_k.data(), 0, buf_k.size());
        ggml_backend_tensor_set(v_l[il], buf_v.data(), 0, buf_v.size());
    }
#else
    for (uint32_t i = 0; i < ids.size(); ++i) {
        const uint32_t id = ids[i];

        if (i == id || id == ids.size()) {
            continue;
        }

        uint32_t nm = 1;

        while (i + nm < ids.size() && ids[i + nm] == id + nm) {
            nm++;
        }

        for (uint32_t il = 0; il < hparams.n_layer; ++il) { // NOLINT
            const int64_t n_embd_k_gqa = hparams.n_embd_k_gqa(il);
            const int64_t n_embd_v_gqa = hparams.n_embd_v_gqa(il);

            ggml_tensor * view_k_src = ggml_view_2d(ctx0, kv_self->k_l[il],
                    n_embd_k_gqa, nm,
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa),
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa*i));

            ggml_tensor * view_k_dst = ggml_view_2d(ctx0, kv_self->k_l[il],
                    n_embd_k_gqa, nm,
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa),
                    ggml_row_size(kv_self->k_l[il]->type, n_embd_k_gqa*id));

            ggml_tensor * view_v_src;
            ggml_tensor * view_v_dst;

            if (cparams.flash_attn) {
                // NOTE: the V cache is not transposed when using flash attention
                view_v_src = ggml_view_2d(ctx0, kv_self->v_l[il],
                        n_embd_v_gqa, nm,
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa),
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa*i));

                view_v_dst = ggml_view_2d(ctx0, kv_self->v_l[il],
                        n_embd_v_gqa, nm,
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa),
                        ggml_row_size(kv_self->v_l[il]->type, n_embd_v_gqa*id));
            } else {
                view_v_src = ggml_view_2d(ctx0, kv_self->v_l[il],
                        nm, n_embd_v_gqa,
                        ggml_row_size(kv_self->v_l[il]->type, kv_self->size),
                        ggml_row_size(kv_self->v_l[il]->type, i));

                view_v_dst = ggml_view_2d(ctx0, kv_self->v_l[il],
                        nm, n_embd_v_gqa,
                        ggml_row_size(kv_self->v_l[il]->type, kv_self->size),
                        ggml_row_size(kv_self->v_l[il]->type, id));
            }

            ggml_build_forward_expand(gf, ggml_cpy(ctx0, view_k_src, view_k_dst));
            ggml_build_forward_expand(gf, ggml_cpy(ctx0, view_v_src, view_v_dst));
        }

        i += nm - 1;
    }

    //LLAMA_LOG_INFO("gf->n_nodes = %d\n", gf->n_nodes);
#endif

    return res;
}